

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

void check_attr_handler(exr_context_t ctxt,exr_attribute_t *attr)

{
  long in_RSI;
  exr_attribute_t **unaff_retaddr;
  char *in_stack_00000008;
  exr_result_t rv;
  exr_attribute_t *handler;
  
  if (*(int *)(in_RSI + 0x14) == 0x1e) {
    exr_attr_list_find_by_name
              ((exr_const_context_t)attr,(exr_attribute_list_t *)handler,in_stack_00000008,
               unaff_retaddr);
  }
  return;
}

Assistant:

static void
check_attr_handler (exr_context_t ctxt, exr_attribute_t* attr)
{
    if (attr->type == EXR_ATTR_OPAQUE)
    {
        exr_attribute_t* handler = NULL;
        exr_result_t     rv      = exr_attr_list_find_by_name (
            ctxt, &(ctxt->custom_handlers), attr->type_name, &handler);
        if (rv == EXR_ERR_SUCCESS && handler)
        {
            attr->opaque->unpack_func_ptr = handler->opaque->unpack_func_ptr;
            attr->opaque->pack_func_ptr   = handler->opaque->pack_func_ptr;
            attr->opaque->destroy_unpacked_func_ptr =
                handler->opaque->destroy_unpacked_func_ptr;
        }
    }
}